

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlockMap.cpp
# Opt level: O0

BVStatic<256UL> * __thiscall
Memory::HeapBlockMap64::GetMarkBitVectorForPages<256ul>(HeapBlockMap64 *this,void *address)

{
  code *pcVar1;
  bool bVar2;
  Node *pNVar3;
  undefined4 *puVar4;
  BVStatic<256UL> *pBVar5;
  Node *node;
  void *address_local;
  HeapBlockMap64 *this_local;
  
  pNVar3 = FindNode(this,address);
  if (pNVar3 == (Node *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlockMap.cpp"
                       ,0x52e,"(node != nullptr)","node != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  pBVar5 = HeapBlockMap32::GetMarkBitVectorForPages<256ul>(&pNVar3->map,address);
  return pBVar5;
}

Assistant:

BVStatic<BitCount>* HeapBlockMap64::GetMarkBitVectorForPages(void * address)
{
    Node * node = FindNode(address);
    Assert(node != nullptr);
    return node->map.GetMarkBitVectorForPages<BitCount>(address);
}